

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gsl.hpp
# Opt level: O2

bool pstore::gsl::operator<(span<int,__1L> *lhs,span<int,__1L> *rhs)

{
  bool bVar1;
  span_iterator<pstore::gsl::span<int,__1L>,_false> sStack_68;
  span_iterator<pstore::gsl::span<int,__1L>,_false> local_58;
  span_iterator<pstore::gsl::span<int,__1L>,_false> local_48;
  span_iterator<pstore::gsl::span<int,__1L>,_false> local_38;
  
  span<int,_-1L>::begin((span<int,__1L> *)&local_38);
  span<int,_-1L>::end((span<int,__1L> *)&local_48);
  span<int,_-1L>::begin((span<int,__1L> *)&local_58);
  span<int,_-1L>::end((span<int,__1L> *)&sStack_68);
  bVar1 = std::
          lexicographical_compare<pstore::gsl::details::span_iterator<pstore::gsl::span<int,_1l>,false>,pstore::gsl::details::span_iterator<pstore::gsl::span<int,_1l>,false>>
                    (&local_38,&local_48,&local_58,&sStack_68);
  return bVar1;
}

Assistant:

constexpr bool operator< (span<ElementType, Extent> const & lhs,
                                  span<ElementType, Extent> const & rhs) {
            return std::lexicographical_compare (lhs.begin (), lhs.end (), rhs.begin (),
                                                 rhs.end ());
        }